

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_Flate.cc
# Opt level: O0

void __thiscall Pl_Flate::Members::Members(Members *this,size_t out_bufsize,action_e action)

{
  bool bVar1;
  uint uVar2;
  void *pvVar3;
  runtime_error *this_00;
  element_type *peVar4;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  undefined8 *local_48;
  z_stream *zstream;
  shared_ptr<unsigned_char> local_30;
  action_e local_1c;
  size_t sStack_18;
  action_e action_local;
  size_t out_bufsize_local;
  Members *this_local;
  
  local_1c = action;
  sStack_18 = out_bufsize;
  out_bufsize_local = (size_t)this;
  std::shared_ptr<unsigned_char>::shared_ptr(&this->outbuf);
  this->out_bufsize = sStack_18;
  this->action = local_1c;
  this->initialized = false;
  this->zdata = (void *)0x0;
  this->written = 0;
  std::function<void_(const_char_*,_int)>::function(&this->callback);
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &this->zopfli_buf);
  QUtil::make_shared_array<unsigned_char>((QUtil *)&local_30,sStack_18);
  std::shared_ptr<unsigned_char>::operator=(&this->outbuf,&local_30);
  std::shared_ptr<unsigned_char>::~shared_ptr(&local_30);
  pvVar3 = operator_new(0x70);
  this->zdata = pvVar3;
  if (sStack_18 < 0x100000000) {
    local_48 = (undefined8 *)this->zdata;
    local_48[8] = 0;
    local_48[9] = 0;
    local_48[10] = 0;
    *local_48 = 0;
    *(undefined4 *)(local_48 + 1) = 0;
    peVar4 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get
                       ((__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_48[3] = peVar4;
    uVar2 = QIntC::to_uint<unsigned_long>(&stack0xffffffffffffffe8);
    *(uint *)(local_48 + 4) = uVar2;
    if ((local_1c == a_deflate) && (bVar1 = zopfli_enabled(), bVar1)) {
      std::make_unique<std::__cxx11::string>();
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->zopfli_buf,&local_50);
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&local_50);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,"Pl_Flate: zlib doesn\'t support buffer sizes larger than unsigned int");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Pl_Flate::Members::Members(size_t out_bufsize, action_e action) :
    out_bufsize(out_bufsize),
    action(action),
    initialized(false),
    zdata(nullptr)
{
    this->outbuf = QUtil::make_shared_array<unsigned char>(out_bufsize);
    // Indirect through zdata to reach the z_stream so we don't have to include zlib.h in
    // Pl_Flate.hh.  This means people using shared library versions of qpdf don't have to have zlib
    // development files available, which particularly helps in a Windows environment.
    this->zdata = new z_stream;

    if (out_bufsize > UINT_MAX) {
        throw std::runtime_error(
            "Pl_Flate: zlib doesn't support buffer sizes larger than unsigned int");
    }

    z_stream& zstream = *(static_cast<z_stream*>(this->zdata));
    zstream.zalloc = nullptr;
    zstream.zfree = nullptr;
    zstream.opaque = nullptr;
    zstream.next_in = nullptr;
    zstream.avail_in = 0;
    zstream.next_out = this->outbuf.get();
    zstream.avail_out = QIntC::to_uint(out_bufsize);

    if (action == a_deflate && Pl_Flate::zopfli_enabled()) {
        zopfli_buf = std::make_unique<std::string>();
    }
}